

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

int testCharRangeByte4(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar *pxVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int value;
  char *data;
  uchar uStack_38;
  uchar uStack_37;
  uchar lows [6];
  int c;
  int len;
  int L;
  int l;
  int K;
  int k;
  int j;
  int i;
  xmlParserCtxtPtr ctxt_local;
  
  data._2_4_ = 0xc1818000;
  data._6_2_ = 0xbfff;
  pxVar2 = ctxt->input->cur;
  pxVar2[4] = '\0';
  k = 0xf0;
  do {
    if (0xff < k) {
      return 0;
    }
    for (K = 0; K < 0x100; K = K + 1) {
      for (l = 0; l < 6; l = l + 1) {
        for (len = 0; len < 6; len = len + 1) {
          *pxVar2 = (xmlChar)k;
          pxVar2[1] = (xmlChar)K;
          bVar1 = *(byte *)((long)&data + (long)l + 2);
          uVar3 = (uint)bVar1;
          pxVar2[2] = bVar1;
          bVar1 = *(byte *)((long)&data + (long)len + 2);
          uVar4 = (uint)bVar1;
          pxVar2[3] = bVar1;
          uVar5 = (uVar4 & 0x3f) + (uVar3 & 0x3f) * 0x40 + (K & 0x3fU) * 0x1000 + (k & 7U) * 0x40000
          ;
          ctxt->nbErrors = 0;
          uVar6 = testCurrentChar(ctxt,(int *)(lows + 2));
          uStack_38 = (char)uVar6;
          uStack_37 = (char)(uVar6 >> 8);
          lows[0] = (char)(uVar6 >> 0x10);
          lows[1] = (char)(uVar6 >> 0x18);
          if (-1 < (int)uVar6) {
            if ((k & 0xf8U) == 0xf8) {
              if (lastError != 0x51) {
                fprintf(_stderr,
                        "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X 0x%02X\n",
                        (ulong)(uint)k,(ulong)(uint)K,(ulong)uVar3,(ulong)(uint)(int)(char)pxVar2[3]
                       );
                return 1;
              }
            }
            else if ((((K & 0xc0U) == 0x80) && ((uVar3 & 0xc0) == 0x80)) && ((uVar4 & 0xc0) == 0x80)
                    ) {
              if (((k & 7U) == 0) && ((K & 0x30U) == 0)) {
                if (lastError != 0x51) {
                  fprintf(_stderr,
                          "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X 0x%02X\n",
                          (ulong)(uint)k,(ulong)(uint)K,(ulong)uVar3,(ulong)uVar4);
                  return 1;
                }
              }
              else if (((uVar5 < 0xd800) || (0xdfff < uVar5)) && (uVar5 < 0x110000)) {
                if ((lastError != 0) || (lows._2_4_ != 4)) {
                  fprintf(_stderr,"Failed to parse char for Bytes 0x%02X 0x%02X 0x%02X\n",
                          (ulong)(uint)k,(ulong)(uint)K,(ulong)uVar3);
                  return 1;
                }
                if (uVar6 != uVar5) {
                  fprintf(_stderr,
                          "Failed to parse char for Bytes 0x%02X 0x%02X 0x%02X: expect %d got %d\n",
                          (ulong)(uint)k,(ulong)(uint)K,(ulong)(uint)(int)(char)pxVar2[2],
                          (ulong)uVar5,uVar6);
                  return 1;
                }
              }
              else if (lastError != 0x51) {
                fprintf(_stderr,
                        "Failed to detect invalid char 0x%04X for Bytes 0x%02X 0x%02X 0x%02X 0x%02X\n"
                        ,(ulong)uVar5,(ulong)(uint)k,(ulong)(uint)K,(ulong)uVar3,uVar4);
                return 1;
              }
            }
            else if (lastError != 0x51) {
              fprintf(_stderr,
                      "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X 0x%02X\n",
                      (ulong)(uint)k,(ulong)(uint)K,(ulong)uVar3,(ulong)uVar4);
              return 1;
            }
          }
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

static int testCharRangeByte4(xmlParserCtxtPtr ctxt) {
    int i, j, k, K, l, L;
    int len, c;
    unsigned char lows[6] = {0, 0x80, 0x81, 0xC1, 0xFF, 0xBF};
    char *data = (char *) ctxt->input->cur;
    int value;

    data[4] = 0;
    for (i = 0xF0;i <= 0xFF;i++) {
    for (j = 0;j <= 0xFF;j++) {
    for (k = 0;k < 6;k++) {
    for (l = 0;l < 6;l++) {
	data[0] = (char) i;
	data[1] = (char) j;
	K = lows[k];
	data[2] = (char) K;
	L = lows[l];
	data[3] = (char) L;
	value = (L & 0x3F) + ((K & 0x3F) << 6) + ((j & 0x3F) << 12) +
	        ((i & 0x7) << 18);
        ctxt->nbErrors = 0;

        c = testCurrentChar(ctxt, &len);
        if (c < 0)
            continue;

	/*
	 * if fifth bit of first char is set, then the sequence would need
	 * at least 5 bytes, but we give only 4 !
	 */
	if ((i & 0xF8) == 0xF8) {
	    if (lastError != XML_ERR_INVALID_ENCODING) {
		fprintf(stderr,
  "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X 0x%02X\n",
			i, j, K, data[3]);
		return(1);
	    }
	}

        /*
	 * The second, third and fourth bytes must start with 10
	 */
	else if (((j & 0xC0) != 0x80) || ((K & 0xC0) != 0x80) ||
	         ((L & 0xC0) != 0x80)) {
	    if (lastError != XML_ERR_INVALID_ENCODING) {
		fprintf(stderr,
	"Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X 0x%02X\n",
			i, j, K, L);
		return(1);
	    }
	}

	/*
	 * if using a 3 byte encoding then the value must be greater
	 * than 0x10000, i.e. one of bits 3 to 0 of i must be set or
	 * the 6 or 5th byte of j must be set
	 */
	else if (((i & 0x7) == 0) && ((j & 0x30) == 0)) {
	    if (lastError != XML_ERR_INVALID_ENCODING) {
		fprintf(stderr,
	"Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X 0x%02X\n",
			i, j, K, L);
		return(1);
	    }
	}

        /*
	 * There are values in that are not allowed in UTF-8
	 */
	else if (((value > 0xD7FF) && (value < 0xE000)) ||
		 (value > 0x10FFFF)) {
	    if (lastError != XML_ERR_INVALID_ENCODING) {
		fprintf(stderr,
"Failed to detect invalid char 0x%04X for Bytes 0x%02X 0x%02X 0x%02X 0x%02X\n",
			value, i, j, K, L);
		return(1);
	    }
	}

	/*
	 * We should see no error in remaining cases
	 */
	else if ((lastError != 0) || (len != 4)) {
	    fprintf(stderr,
		"Failed to parse char for Bytes 0x%02X 0x%02X 0x%02X\n",
		    i, j, K);
	    return(1);
	}

	/*
	 * Finally check the value is right
	 */
	else if (c != value) {
	    fprintf(stderr,
    "Failed to parse char for Bytes 0x%02X 0x%02X 0x%02X: expect %d got %d\n",
		i, j, data[2], value, c);
	    return(1);
	}
    }
    }
    }
    }
    return(0);
}